

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O2

void ScaleARGBRowDown2Box_SSE2
               (uint8_t *src_argb,ptrdiff_t src_stride,uint8_t *dst_argb,int dst_width)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  uint8_t *puVar25;
  uint8_t *puVar26;
  uint8_t *puVar27;
  uint8_t *puVar28;
  uint8_t *puVar29;
  uint8_t *puVar30;
  uint8_t *puVar31;
  uint8_t *puVar32;
  uint8_t *puVar33;
  uint8_t *puVar34;
  int iVar35;
  undefined1 uVar36;
  uint8_t uVar37;
  undefined1 uVar38;
  uint8_t uVar39;
  undefined1 uVar40;
  uint8_t uVar41;
  undefined1 uVar42;
  uint8_t uVar43;
  undefined1 uVar44;
  uint8_t uVar45;
  undefined1 uVar46;
  uint8_t uVar47;
  undefined1 uVar48;
  uint8_t uVar49;
  undefined1 uVar50;
  uint8_t uVar51;
  undefined1 uVar52;
  uint8_t uVar53;
  undefined1 uVar54;
  uint8_t uVar55;
  undefined1 uVar56;
  uint8_t uVar57;
  undefined1 uVar58;
  uint8_t uVar59;
  undefined1 uVar60;
  uint8_t uVar61;
  undefined1 uVar62;
  uint8_t uVar63;
  undefined1 uVar64;
  uint8_t uVar65;
  undefined1 uVar66;
  uint8_t uVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  undefined1 uVar70;
  undefined1 uVar71;
  undefined1 uVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  undefined1 uVar75;
  undefined1 uVar76;
  undefined1 uVar77;
  undefined1 uVar78;
  undefined1 uVar79;
  undefined1 uVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  undefined1 uVar83;
  
  do {
    uVar37 = *src_argb;
    puVar5 = src_argb + 1;
    puVar6 = src_argb + 2;
    puVar7 = src_argb + 3;
    puVar8 = src_argb + 4;
    puVar9 = src_argb + 5;
    puVar10 = src_argb + 6;
    puVar11 = src_argb + 7;
    puVar12 = src_argb + 8;
    puVar13 = src_argb + 9;
    puVar14 = src_argb + 10;
    puVar15 = src_argb + 0xb;
    puVar16 = src_argb + 0xc;
    puVar17 = src_argb + 0xd;
    puVar18 = src_argb + 0xe;
    puVar19 = src_argb + 0xf;
    puVar1 = src_argb + 0x10;
    puVar20 = src_argb + 0x11;
    puVar21 = src_argb + 0x12;
    puVar22 = src_argb + 0x13;
    puVar23 = src_argb + 0x14;
    puVar24 = src_argb + 0x15;
    puVar25 = src_argb + 0x16;
    puVar26 = src_argb + 0x17;
    puVar27 = src_argb + 0x18;
    puVar28 = src_argb + 0x19;
    puVar29 = src_argb + 0x1a;
    puVar30 = src_argb + 0x1b;
    puVar31 = src_argb + 0x1c;
    puVar32 = src_argb + 0x1d;
    puVar33 = src_argb + 0x1e;
    puVar34 = src_argb + 0x1f;
    puVar2 = src_argb + src_stride;
    puVar3 = src_argb + src_stride + 0x10;
    src_argb = src_argb + 0x20;
    uVar36 = pavgb(uVar37,*puVar2);
    uVar38 = pavgb(*puVar5,puVar2[1]);
    uVar40 = pavgb(*puVar6,puVar2[2]);
    uVar42 = pavgb(*puVar7,puVar2[3]);
    uVar44 = pavgb(*puVar8,puVar2[4]);
    uVar46 = pavgb(*puVar9,puVar2[5]);
    uVar48 = pavgb(*puVar10,puVar2[6]);
    uVar50 = pavgb(*puVar11,puVar2[7]);
    uVar52 = pavgb(*puVar12,puVar2[8]);
    uVar54 = pavgb(*puVar13,puVar2[9]);
    uVar56 = pavgb(*puVar14,puVar2[10]);
    uVar58 = pavgb(*puVar15,puVar2[0xb]);
    uVar60 = pavgb(*puVar16,puVar2[0xc]);
    uVar62 = pavgb(*puVar17,puVar2[0xd]);
    uVar64 = pavgb(*puVar18,puVar2[0xe]);
    uVar66 = pavgb(*puVar19,puVar2[0xf]);
    uVar68 = pavgb(*puVar1,*puVar3);
    uVar69 = pavgb(*puVar20,puVar3[1]);
    uVar70 = pavgb(*puVar21,puVar3[2]);
    uVar71 = pavgb(*puVar22,puVar3[3]);
    uVar72 = pavgb(*puVar23,puVar3[4]);
    uVar73 = pavgb(*puVar24,puVar3[5]);
    uVar74 = pavgb(*puVar25,puVar3[6]);
    uVar75 = pavgb(*puVar26,puVar3[7]);
    uVar76 = pavgb(*puVar27,puVar3[8]);
    uVar77 = pavgb(*puVar28,puVar3[9]);
    uVar78 = pavgb(*puVar29,puVar3[10]);
    uVar79 = pavgb(*puVar30,puVar3[0xb]);
    uVar80 = pavgb(*puVar31,puVar3[0xc]);
    uVar81 = pavgb(*puVar32,puVar3[0xd]);
    uVar82 = pavgb(*puVar33,puVar3[0xe]);
    uVar83 = pavgb(*puVar34,puVar3[0xf]);
    uVar37 = pavgb(uVar36,uVar44);
    uVar39 = pavgb(uVar38,uVar46);
    uVar41 = pavgb(uVar40,uVar48);
    uVar43 = pavgb(uVar42,uVar50);
    uVar45 = pavgb(uVar52,uVar60);
    uVar47 = pavgb(uVar54,uVar62);
    uVar49 = pavgb(uVar56,uVar64);
    uVar51 = pavgb(uVar58,uVar66);
    uVar53 = pavgb(uVar68,uVar72);
    uVar55 = pavgb(uVar69,uVar73);
    uVar57 = pavgb(uVar70,uVar74);
    uVar59 = pavgb(uVar71,uVar75);
    uVar61 = pavgb(uVar76,uVar80);
    uVar63 = pavgb(uVar77,uVar81);
    uVar65 = pavgb(uVar78,uVar82);
    uVar67 = pavgb(uVar79,uVar83);
    *dst_argb = uVar37;
    dst_argb[1] = uVar39;
    dst_argb[2] = uVar41;
    dst_argb[3] = uVar43;
    dst_argb[4] = uVar45;
    dst_argb[5] = uVar47;
    dst_argb[6] = uVar49;
    dst_argb[7] = uVar51;
    dst_argb[8] = uVar53;
    dst_argb[9] = uVar55;
    dst_argb[10] = uVar57;
    dst_argb[0xb] = uVar59;
    dst_argb[0xc] = uVar61;
    dst_argb[0xd] = uVar63;
    dst_argb[0xe] = uVar65;
    dst_argb[0xf] = uVar67;
    dst_argb = dst_argb + 0x10;
    iVar35 = dst_width + -4;
    bVar4 = 3 < dst_width;
    dst_width = iVar35;
  } while (iVar35 != 0 && bVar4);
  return;
}

Assistant:

void ScaleARGBRowDown2Box_SSE2(const uint8_t* src_argb,
                               ptrdiff_t src_stride,
                               uint8_t* dst_argb,
                               int dst_width) {
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x00(%0,%3,1),%%xmm2          \n"
      "movdqu      0x10(%0,%3,1),%%xmm3          \n"
      "lea         0x20(%0),%0                   \n"
      "pavgb       %%xmm2,%%xmm0                 \n"
      "pavgb       %%xmm3,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "shufps      $0x88,%%xmm1,%%xmm0           \n"
      "shufps      $0xdd,%%xmm1,%%xmm2           \n"
      "pavgb       %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),              // %0
        "+r"(dst_argb),              // %1
        "+r"(dst_width)              // %2
      : "r"((intptr_t)(src_stride))  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3");
}